

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::Var> __thiscall kratos::Var::cast(Var *this,VarCastType cast_type)

{
  bool bVar1;
  VarCastType VVar2;
  element_type *this_00;
  VarCastType in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_00000034;
  long lVar4;
  shared_ptr<kratos::Var> sVar5;
  long local_58;
  undefined1 local_50 [8];
  shared_ptr<kratos::VarCasted> v;
  shared_ptr<kratos::VarCasted> *casted;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  *__range2;
  VarCastType cast_type_local;
  Var *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  lVar4 = CONCAT44(in_register_00000034,cast_type);
  if ((in_EDX == Signed) && ((*(byte *)(lVar4 + 0xf0) & 1) != 0)) {
    sVar5 = std::enable_shared_from_this<kratos::Var>::shared_from_this
                      ((enable_shared_from_this<kratos::Var> *)this);
    _Var3 = sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    __end2 = std::
             set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
             ::begin((set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
                      *)(lVar4 + 0x208));
    casted = (shared_ptr<kratos::VarCasted> *)
             std::
             set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
             ::end((set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
                    *)(lVar4 + 0x208));
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&casted);
      if (!bVar1) break;
      v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_Rb_tree_const_iterator<std::shared_ptr<kratos::VarCasted>_>::operator*(&__end2);
      this_00 = std::
                __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
      VVar2 = VarCasted::cast_type(this_00);
      if ((VVar2 == in_EDX) && (in_EDX != Resize)) {
        std::shared_ptr<kratos::Var>::shared_ptr<kratos::VarCasted,void>
                  ((shared_ptr<kratos::Var> *)this,
                   (shared_ptr<kratos::VarCasted> *)
                   v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        _Var3._M_pi = extraout_RDX;
        goto LAB_0023a2ca;
      }
      std::_Rb_tree_const_iterator<std::shared_ptr<kratos::VarCasted>_>::operator++(&__end2);
    }
    local_58 = lVar4;
    std::make_shared<kratos::VarCasted,kratos::Var*,kratos::VarCastType&>
              ((Var **)local_50,(VarCastType *)&local_58);
    std::
    set<std::shared_ptr<kratos::VarCasted>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
    ::emplace<std::shared_ptr<kratos::VarCasted>&>
              ((set<std::shared_ptr<kratos::VarCasted>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                *)(lVar4 + 0x208),(shared_ptr<kratos::VarCasted> *)local_50);
    std::shared_ptr<kratos::Var>::shared_ptr<kratos::VarCasted,void>
              ((shared_ptr<kratos::Var> *)this,(shared_ptr<kratos::VarCasted> *)local_50);
    std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_50);
    _Var3._M_pi = extraout_RDX_00;
  }
LAB_0023a2ca:
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Var::cast(VarCastType cast_type) {
    if (cast_type == VarCastType::Signed && is_signed_) {
        return shared_from_this();
    } else {
        // optimize memory for speed
        for (auto const &casted : casted_) {
            if (casted->cast_type() == cast_type && cast_type != VarCastType::Resize) {
                return casted;
            }
        }
        auto v = std::make_shared<VarCasted>(this, cast_type);
        casted_.emplace(v);
        return v;
    }
}